

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlElementType xVar1;
  xmlRelaxNGGrammarPtr_conflict pxVar2;
  xmlDocPtr pxVar3;
  int iVar4;
  int iVar5;
  xmlRelaxNGValidStatePtr pxVar6;
  xmlNodePtr pxVar7;
  xmlRelaxNGStatesPtr pxVar8;
  xmlDocPtr pxVar9;
  long lVar10;
  bool bVar11;
  xmlValidCtxt local_a8;
  
  if (doc == (xmlDocPtr)0x0 || ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    return -1;
  }
  ctxt->doc = doc;
  iVar4 = -1;
  if (ctxt->schema != (xmlRelaxNGPtr)0x0) {
    ctxt->errNo = 0;
    pxVar2 = ctxt->schema->topgrammar;
    if (pxVar2 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOGRAMMAR,(xmlChar *)0x0,(xmlChar *)0x0,0);
    }
    else {
      pxVar6 = xmlRelaxNGNewValidState(ctxt,(xmlNodePtr)0x0);
      ctxt->state = pxVar6;
      iVar4 = xmlRelaxNGValidateDefinition(ctxt,pxVar2->start);
      if ((ctxt->state == (xmlRelaxNGValidStatePtr)0x0) || (pxVar6->seq == (xmlNodePtr)0x0)) {
        pxVar8 = ctxt->states;
        if (pxVar8 != (xmlRelaxNGStatesPtr)0x0) {
          if (pxVar8->nbState < 1) {
            bVar11 = true;
          }
          else {
            iVar5 = -1;
            lVar10 = 0;
            do {
              pxVar6 = pxVar8->tabState[lVar10];
              pxVar7 = xmlRelaxNGSkipIgnored(ctxt,pxVar6->seq);
              if (pxVar7 == (xmlNodePtr)0x0) {
                iVar5 = 0;
              }
              xmlRelaxNGFreeValidState(ctxt,pxVar6);
              lVar10 = lVar10 + 1;
              pxVar8 = ctxt->states;
            } while (lVar10 < pxVar8->nbState);
            bVar11 = iVar5 == -1;
          }
          if (bVar11) goto LAB_00170928;
        }
      }
      else {
        pxVar7 = xmlRelaxNGSkipIgnored(ctxt,ctxt->state->seq);
        if (pxVar7 != (xmlNodePtr)0x0) {
LAB_00170928:
          if (iVar4 != -1) {
            xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_EXTRADATA,(xmlChar *)0x0,(xmlChar *)0x0,0);
            iVar4 = -1;
          }
        }
      }
      if (ctxt->state != (xmlRelaxNGValidStatePtr)0x0) {
        xmlRelaxNGFreeValidState(ctxt,ctxt->state);
        ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
      }
      if (iVar4 == 0) {
        if (ctxt->idref == 1) goto LAB_0017097e;
LAB_001709db:
        iVar4 = -(uint)(ctxt->errNo != 0);
      }
      else {
        xmlRelaxNGDumpValidError(ctxt);
        if (ctxt->idref == 1) {
LAB_0017097e:
          bVar11 = iVar4 == 0;
          local_a8.doc = (xmlDocPtr)0x0;
          local_a8.vstateTab = (xmlValidState *)0x0;
          local_a8.am = (xmlAutomataPtr)0x0;
          local_a8.vstate = (xmlValidState *)0x0;
          local_a8.vstateNr = 0;
          local_a8.vstateMax = 0;
          local_a8.nodeTab = (xmlNodePtr *)0x0;
          local_a8.flags = 0;
          local_a8._52_4_ = 0;
          local_a8.node = (xmlNodePtr)0x0;
          local_a8.nodeNr = 0;
          local_a8.nodeMax = 0;
          local_a8.state = (xmlAutomataStatePtr)0x0;
          local_a8.valid = 1;
          local_a8._68_4_ = 0;
          local_a8.warning = ctxt->warning;
          local_a8.userData = ctxt->userData;
          local_a8.error = ctxt->error;
          iVar5 = xmlValidateDocumentFinal(&local_a8,doc);
          if (iVar5 != 1) {
            iVar4 = -1;
          }
          if (iVar5 == 1 && bVar11) goto LAB_001709db;
        }
      }
    }
  }
  xVar1 = doc->type;
  if ((xVar1 != XML_HTML_DOCUMENT_NODE) && (xVar1 != XML_DOCUMENT_NODE)) {
    if (xVar1 != XML_ELEMENT_NODE) goto LAB_00170a39;
    doc->version = (xmlChar *)0x0;
  }
  pxVar3 = (xmlDocPtr)doc->children;
  if ((xmlDocPtr)doc->children != (xmlDocPtr)0x0) {
LAB_00170a08:
    pxVar9 = pxVar3;
    if (pxVar9->type == XML_ELEMENT_NODE) goto code_r0x00170a11;
    goto LAB_00170a22;
  }
LAB_00170a39:
  iVar5 = 1;
  if (iVar4 != -1) {
    iVar5 = iVar4;
  }
  return iVar5;
code_r0x00170a11:
  pxVar9->version = (xmlChar *)0x0;
  pxVar3 = (xmlDocPtr)pxVar9->children;
  if ((xmlDocPtr)pxVar9->children == (xmlDocPtr)0x0) {
LAB_00170a22:
    while (pxVar3 = (xmlDocPtr)pxVar9->next, (xmlDocPtr)pxVar9->next == (xmlDocPtr)0x0) {
      pxVar9 = (xmlDocPtr)pxVar9->parent;
      if ((pxVar9 == (xmlDocPtr)0x0) || (pxVar9 == doc)) goto LAB_00170a39;
    }
  }
  goto LAB_00170a08;
}

Assistant:

int
xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt, xmlDocPtr doc)
{
    int ret;

    if ((ctxt == NULL) || (doc == NULL))
        return (-1);

    ctxt->doc = doc;

    ret = xmlRelaxNGValidateDocument(ctxt, doc);
    /*
     * Remove all left PSVI
     */
    xmlRelaxNGCleanPSVI((xmlNodePtr) doc);

    /*
     * TODO: build error codes
     */
    if (ret == -1)
        return (1);
    return (ret);
}